

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::resolver::on_lookup
          (resolver *this,error_code *ec,results_type *ips,string *hostname)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>_>
  *this_00;
  undefined8 *puVar1;
  long lVar2;
  pointer paVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar5;
  _Base_ptr p_Var6;
  error_category *peVar7;
  bool bVar8;
  undefined3 uVar9;
  mapped_type *pmVar10;
  time_point tVar11;
  __node_type *p_Var12;
  iterator __it;
  mapped_type *pmVar13;
  const_iterator cVar14;
  __node_type *p_Var15;
  const_iterator cVar16;
  const_iterator cVar17;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
  __it_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
  __it_01;
  long lVar18;
  long lVar19;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  pVar20;
  basic_resolver_entry<boost::asio::ip::tcp> i;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> local_108;
  uint local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  _Any_data local_a8;
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Any_data local_88;
  _Base_ptr local_78;
  _Base_ptr local_70;
  resolver *local_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_60;
  string *local_58;
  address local_50;
  
  this_00 = &this->m_failed_cache;
  if (ec->failed_ == true) {
    pmVar10 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,hostname);
    tVar11 = time_now();
    (pmVar10->last_seen).__d.__r = (rep)tVar11.__d.__r;
    bVar8 = ec->failed_;
    uVar9 = *(undefined3 *)&ec->field_0x5;
    peVar7 = ec->cat_;
    (pmVar10->error).val_ = ec->val_;
    (pmVar10->error).failed_ = bVar8;
    *(undefined3 *)&(pmVar10->error).field_0x5 = uVar9;
    (pmVar10->error).cat_ = peVar7;
    if (this->m_max_size < (int)(this->m_failed_cache)._M_h._M_element_count) {
      p_Var12 = (__node_type *)(this->m_failed_cache)._M_h._M_before_begin._M_nxt;
      __it_00._M_cur = p_Var12;
      if (p_Var12 == (__node_type *)0x0) {
        __it_00._M_cur = (__node_type *)0x0;
      }
      else {
        do {
          if (*(long *)((long)&(p_Var12->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>
                               ._M_storage._M_storage + 0x20) <
              *(long *)((long)&((__it_00._M_cur)->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>
                               ._M_storage._M_storage + 0x20)) {
            __it_00._M_cur = p_Var12;
          }
          p_Var12 = (__node_type *)(p_Var12->super__Hash_node_base)._M_nxt;
        } while (p_Var12 != (__node_type *)0x0);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&this_00->_M_h,(const_iterator)__it_00._M_cur);
    }
    pVar20 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
             ::equal_range(&(this->m_callbacks)._M_t,hostname);
    cVar17._M_node = (_Base_ptr)pVar20.second._M_node;
    cVar14._M_node = (_Base_ptr)pVar20.first._M_node;
    if (cVar14._M_node != cVar17._M_node) {
      cVar16._M_node = cVar14._M_node;
      do {
        local_88._M_unused._M_object = (void *)0x0;
        local_88._8_8_ = (_Base_ptr)0x0;
        local_78 = (_Base_ptr)0x0;
        local_70 = cVar16._M_node[2]._M_right;
        p_Var6 = cVar16._M_node[2]._M_left;
        if (p_Var6 != (_Base_ptr)0x0) {
          local_88._M_unused._0_8_ = (undefined8)*(undefined8 *)(cVar16._M_node + 2);
          local_88._8_8_ = cVar16._M_node[2]._M_parent;
          cVar16._M_node[2]._M_left = (_Base_ptr)0x0;
          cVar16._M_node[2]._M_right = (_Base_ptr)0x0;
          local_78 = p_Var6;
        }
        local_108.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown_5::callback((callback_t *)&local_88,ec,&local_108);
        if (local_108.
            super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.
                          super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_108.
                                super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.
                                super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_78 != (_Base_ptr)0x0) {
          (*(code *)local_78)(&local_88,&local_88,3);
        }
        cVar16._M_node = (_Base_ptr)::std::_Rb_tree_increment(cVar16._M_node);
      } while (cVar16._M_node != cVar17._M_node);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
    ::_M_erase_aux(&(this->m_callbacks)._M_t,cVar14,cVar17);
  }
  else {
    __it = ::std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&this_00->_M_h,hostname);
    if (__it.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
        ._M_cur != (__node_type *)0x0) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&this_00->_M_h,
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
              ._M_cur);
    }
    local_60 = &(this->m_cache)._M_h;
    local_58 = hostname;
    pmVar13 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)local_60,hostname);
    tVar11 = time_now();
    (pmVar13->last_seen).__d.__r = (rep)tVar11.__d.__r;
    paVar3 = (pmVar13->addresses).
             super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pmVar13->addresses).
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_finish != paVar3) {
      (pmVar13->addresses).
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_finish = paVar3;
    }
    peVar4 = (ips->super_basic_resolver_iterator<boost::asio::ip::tcp>).values_.
             super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    this_01 = (ips->super_basic_resolver_iterator<boost::asio::ip::tcp>).values_.
              super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    if (peVar4 != (element_type *)0x0) {
      lVar19 = 0x48;
      lVar18 = 0;
      local_68 = this;
      do {
        lVar5 = *(long *)&(peVar4->
                          super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                          )._M_impl.super__Vector_impl_data;
        puVar1 = (undefined8 *)(lVar5 + -0x48 + lVar19);
        local_108.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_108.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        lVar2 = lVar5 + -0x3c + lVar19;
        local_108.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar2 + 4);
        local_f0 = *(uint *)(lVar2 + 0xc);
        local_e8[0] = local_d8;
        lVar2 = *(long *)(lVar5 + -0x28 + lVar19);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e8,lVar2,*(long *)(lVar5 + -0x20 + lVar19) + lVar2);
        lVar2 = *(long *)(lVar5 + -8 + lVar19);
        local_c8[0] = local_b8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c8,lVar2,*(long *)(lVar5 + lVar19) + lVar2);
        if ((short)local_108.
                   super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                   ._M_impl.super__Vector_impl_data._M_start != 2) {
          local_50.ipv6_address_.scope_id_ = (unsigned_long)local_f0;
          local_50.ipv6_address_.addr_.__in6_u._0_8_ =
               local_108.
               super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_50.ipv6_address_.addr_.__in6_u._8_8_ =
               local_108.
               super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_50.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          local_50.ipv6_address_.addr_.__in6_u._0_8_ = 0;
          local_50.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          local_50.ipv6_address_.scope_id_ = 0;
          local_50.ipv4_address_.addr_.s_addr =
               (in4_addr_type)
               (in4_addr_type)
               local_108.
               super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
               ._M_impl.super__Vector_impl_data._M_start._4_4_;
        }
        local_50.type_ =
             (anon_enum_32)
             ((short)local_108.
                     super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                     ._M_impl.super__Vector_impl_data._M_start != 2);
        ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
        emplace_back<boost::asio::ip::address>(&pmVar13->addresses,&local_50);
        if (local_c8[0] != local_b8) {
          operator_delete(local_c8[0],local_b8[0] + 1);
        }
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        lVar18 = lVar18 + 1;
        lVar19 = lVar19 + 0x60;
        this = local_68;
      } while (lVar18 != ((long)*(pointer *)
                                 ((long)&(peVar4->
                                         super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                                         )._M_impl.super__Vector_impl_data + 8) -
                          *(long *)&(peVar4->
                                    super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                                    )._M_impl.super__Vector_impl_data >> 5) * -0x5555555555555555);
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    pVar20 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
             ::equal_range(&(this->m_callbacks)._M_t,local_58);
    cVar17._M_node = (_Base_ptr)pVar20.second._M_node;
    cVar14._M_node = (_Base_ptr)pVar20.first._M_node;
    if (cVar14._M_node != cVar17._M_node) {
      cVar16._M_node = cVar14._M_node;
      do {
        local_a8._M_unused._M_object = (void *)0x0;
        local_a8._8_8_ = (_Base_ptr)0x0;
        local_98 = (_Base_ptr)0x0;
        local_90 = cVar16._M_node[2]._M_right;
        p_Var6 = cVar16._M_node[2]._M_left;
        if (p_Var6 != (_Base_ptr)0x0) {
          local_a8._M_unused._0_8_ = (undefined8)*(undefined8 *)(cVar16._M_node + 2);
          local_a8._8_8_ = cVar16._M_node[2]._M_parent;
          cVar16._M_node[2]._M_left = (_Base_ptr)0x0;
          cVar16._M_node[2]._M_right = (_Base_ptr)0x0;
          local_98 = p_Var6;
        }
        anon_unknown_5::callback((callback_t *)&local_a8,ec,&pmVar13->addresses);
        if (local_98 != (_Base_ptr)0x0) {
          (*(code *)local_98)(&local_a8,&local_a8,3);
        }
        cVar16._M_node = (_Base_ptr)::std::_Rb_tree_increment(cVar16._M_node);
      } while (cVar16._M_node != cVar17._M_node);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
    ::_M_erase_aux(&(this->m_callbacks)._M_t,cVar14,cVar17);
    if (this->m_max_size < (int)(this->m_cache)._M_h._M_element_count) {
      p_Var15 = (__node_type *)(this->m_cache)._M_h._M_before_begin._M_nxt;
      __it_01._M_cur = p_Var15;
      if (p_Var15 == (__node_type *)0x0) {
        __it_01._M_cur = (__node_type *)0x0;
      }
      else {
        do {
          if (*(long *)((long)&(p_Var15->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>
                               ._M_storage._M_storage + 0x20) <
              *(long *)((long)&((__it_01._M_cur)->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>
                               ._M_storage._M_storage + 0x20)) {
            __it_01._M_cur = p_Var15;
          }
          p_Var15 = (__node_type *)(p_Var15->super__Hash_node_base)._M_nxt;
        } while (p_Var15 != (__node_type *)0x0);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(local_60,(const_iterator)__it_01._M_cur);
    }
  }
  return;
}

Assistant:

void resolver::on_lookup(error_code const& ec, tcp::resolver::results_type ips
		, std::string const& hostname)
	{
		COMPLETE_ASYNC("resolver::on_lookup");
		if (ec)
		{
			failed_dns_cache_entry& ce = m_failed_cache[hostname];
			ce.last_seen = time_now();
			ce.error = ec;

			// if the cache grows too big, weed out the
			// oldest entries
			if (int(m_failed_cache.size()) > m_max_size)
			{
				auto oldest = m_failed_cache.begin();
				for (auto k = m_failed_cache.begin(); k != m_failed_cache.end(); ++k)
				{
					if (k->second.last_seen < oldest->second.last_seen)
						oldest = k;
				}

				// remove the oldest entry
				m_failed_cache.erase(oldest);
			}

			auto const range = m_callbacks.equal_range(hostname);
			for (auto c = range.first; c != range.second; ++c)
				callback(std::move(c->second), ec, {});
			m_callbacks.erase(range.first, range.second);
			return;
		}

		{
			auto const k = m_failed_cache.find(hostname);
			if (k != m_failed_cache.end())
				m_failed_cache.erase(k);
		}

		dns_cache_entry& ce = m_cache[hostname];
		ce.last_seen = time_now();
		ce.addresses.clear();
		for (auto i : ips)
			ce.addresses.push_back(i.endpoint().address());

		auto const range = m_callbacks.equal_range(hostname);
		for (auto c = range.first; c != range.second; ++c)
			callback(std::move(c->second), ec, ce.addresses);
		m_callbacks.erase(range.first, range.second);

		// if m_cache grows too big, weed out the
		// oldest entries
		if (int(m_cache.size()) > m_max_size)
		{
			auto oldest = m_cache.begin();
			for (auto k = m_cache.begin(); k != m_cache.end(); ++k)
			{
				if (k->second.last_seen < oldest->second.last_seen)
					oldest = k;
			}

			// remove the oldest entry
			m_cache.erase(oldest);
		}
	}